

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManPrintPackingStats(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint local_54;
  uint local_50;
  int Count;
  int MaxSize;
  int nEntries2;
  int nEntries;
  int Entry;
  int k;
  int i;
  int nNumStr [5];
  int nObjToShow;
  int fVerbose;
  Gia_Man_t *p_local;
  
  memset(&k,0,0x14);
  local_50 = 0xffffffff;
  local_54 = 0;
  if (p->vPacking != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntEntry(p->vPacking,0);
    Count = 0;
    Entry = 1;
    while (iVar2 = Vec_IntSize(p->vPacking), Entry < iVar2) {
      iVar2 = Vec_IntEntry(p->vPacking,Entry);
      if ((iVar2 < 1) || (3 < iVar2)) {
        __assert_fail("Entry > 0 && Entry < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                      ,0x250,"void Gia_ManPrintPackingStats(Gia_Man_t *)");
      }
      (&k)[iVar2] = (&k)[iVar2] + 1;
      for (nEntries = 0; Entry = Entry + 1, nEntries < iVar2; nEntries = nEntries + 1) {
      }
      Count = Count + 1;
    }
    if (iVar1 != Count) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x25a,"void Gia_ManPrintPackingStats(Gia_Man_t *)");
    }
    if (nNumStr[1] < 1) {
      if (nNumStr[0] < 1) {
        if (0 < i) {
          local_50 = 1;
        }
      }
      else {
        local_50 = 2;
      }
    }
    else {
      local_50 = 3;
    }
    Abc_Print(1,"Packing (N=%d)  :  ",(ulong)local_50);
    for (Entry = 1; Entry <= (int)local_50; Entry = Entry + 1) {
      Abc_Print(1,"%d x LUT = %d   ",(ulong)(uint)Entry,(ulong)(uint)(&k)[Entry]);
      local_54 = Entry * (&k)[Entry] + local_54;
    }
    Abc_Print(1,"Total = %d   ",(ulong)(uint)Count);
    Abc_Print(1,"Total LUT = %d",(ulong)local_54);
    Abc_Print(1,"\n");
  }
  return;
}

Assistant:

void Gia_ManPrintPackingStats( Gia_Man_t * p )
{
    int fVerbose = 0;
    int nObjToShow = 200;
    int nNumStr[5] = {0};
    int i, k, Entry, nEntries, nEntries2, MaxSize = -1, Count = 0;
    if ( p->vPacking == NULL )
        return;
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        nNumStr[Entry]++;
        i++;
        if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "{ " );
        for ( k = 0; k < Entry; k++, i++ )
            if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "%d ", Vec_IntEntry(p->vPacking, i) );
        if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "}\n" );
        i--;
        nEntries2++;
    }
    assert( nEntries == nEntries2 );
    if ( nNumStr[3] > 0 )
        MaxSize = 3;
    else if ( nNumStr[2] > 0 )
        MaxSize = 2;
    else if ( nNumStr[1] > 0 )
        MaxSize = 1;
    Abc_Print( 1, "Packing (N=%d)  :  ", MaxSize );
    for ( i = 1; i <= MaxSize; i++ )
    {
        Abc_Print( 1, "%d x LUT = %d   ", i, nNumStr[i] );
        Count += i * nNumStr[i];
    }
    Abc_Print( 1, "Total = %d   ", nEntries2 );
    Abc_Print( 1, "Total LUT = %d", Count );
    Abc_Print( 1, "\n" );
}